

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1b8a13::CAPIBuildSystemFrontendDelegate::commandProcessHadOutput
          (CAPIBuildSystemFrontendDelegate *this,Command *command,ProcessHandle handle,
          StringRef data)

{
  undefined1 local_50 [8];
  llb_data_t cData;
  Command *command_local;
  CAPIBuildSystemFrontendDelegate *this_local;
  StringRef data_local;
  ProcessHandle handle_local;
  
  local_50 = (undefined1  [8])data.Length;
  cData.length = (uint64_t)data.Data;
  if ((this->cAPIDelegate).command_process_had_output !=
      (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_process_t_ptr_llb_data_t_ptr
       *)0x0) {
    cData.data = (uint8_t *)command;
    (*(this->cAPIDelegate).command_process_had_output)
              ((this->cAPIDelegate).context,(llb_buildsystem_command_t *)command,
               (llb_buildsystem_process_t *)handle.id,(llb_data_t *)local_50);
  }
  return;
}

Assistant:

virtual void commandProcessHadOutput(Command* command, ProcessHandle handle,
                                       StringRef data) override {
    if (cAPIDelegate.command_process_had_output) {
      llb_data_t cData{ data.size(), (const uint8_t*) data.data() };
      cAPIDelegate.command_process_had_output(
          cAPIDelegate.context,
          (llb_buildsystem_command_t*) command,
          (llb_buildsystem_process_t*) handle.id,
          &cData);
    }
  }